

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d9.cpp
# Opt level: O1

void rw::d3d9::instance(ObjPipeline *rwpipe,Atomic *atomic)

{
  ushort uVar1;
  uint uVar2;
  uint uVar3;
  Geometry *geometry;
  long lVar4;
  InstanceDataHeader *pIVar5;
  undefined8 uVar6;
  void *indexBuffer;
  uint16 *puVar7;
  uint uVar8;
  uint uVar9;
  uint uVar10;
  ulong uVar11;
  MeshHeader *pMVar12;
  uint *puVar13;
  
  geometry = atomic->geometry;
  if ((geometry->flags & 0x1000000) == 0) {
    if ((geometry->instData != (InstanceDataHeader *)0x0) &&
       (geometry->instData[1].platform != (uint)geometry->meshHeader->serialNum)) {
      freeInstanceData(geometry);
    }
    if (geometry->instData == (InstanceDataHeader *)0x0) {
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 347"
      ;
      pIVar5 = (InstanceDataHeader *)(*DAT_00148858)(0x70,0x3000f);
      pMVar12 = geometry->meshHeader;
      pIVar5->platform = 9;
      pIVar5[1].platform = (uint)pMVar12->serialNum;
      uVar1 = pMVar12->numMeshes;
      pIVar5[2].platform = (uint)uVar1;
      pIVar5[6].platform = pMVar12->flags == 1 | 4;
      pIVar5[0x14].platform = 0;
      *(undefined8 *)(pIVar5 + 0x16) = 0;
      pIVar5[0x19].platform = geometry->numVertices;
      pIVar5[0x18].platform = pMVar12->totalIndices;
      allocLocation =
           "file: /workspace/llm4binary/github/license_c_cmakelists/aap[P]librw/src/d3d/d3d9.cpp line: 358"
      ;
      uVar6 = (*DAT_00148858)((ulong)uVar1 * 0x30);
      *(undefined8 *)(pIVar5 + 0x1a) = uVar6;
      uVar10 = 0;
      indexBuffer = d3d::createIndexBuffer(pIVar5[0x18].platform * 2,false);
      *(void **)(pIVar5 + 4) = indexBuffer;
      puVar7 = d3d::lockIndices(indexBuffer,0,0,0);
      if (pIVar5[2].platform != 0) {
        pMVar12 = pMVar12 + 1;
        puVar13 = *(uint **)(pIVar5 + 0x1a);
        uVar9 = 0;
        do {
          findMinVertAndNumVertices
                    (*(uint16 **)pMVar12,pMVar12->totalIndices,puVar13 + 1,(int32 *)(puVar13 + 9));
          uVar2 = pMVar12->totalIndices;
          *puVar13 = uVar2;
          *(undefined8 *)(puVar13 + 2) = *(undefined8 *)(pMVar12 + 1);
          puVar13[4] = 0;
          puVar13[6] = 0;
          puVar13[7] = 0;
          uVar3 = puVar13[1];
          puVar13[8] = uVar3;
          puVar13[10] = uVar9;
          if (pIVar5[6].platform == 5) {
            uVar8 = uVar2 - 2;
          }
          else {
            uVar8 = uVar2 / 3;
          }
          puVar13[0xb] = uVar8;
          if (uVar3 == 0) {
            memcpy(puVar7 + uVar9,*(void **)pMVar12,(ulong)(uVar2 * 2));
          }
          else if ((ulong)uVar2 != 0) {
            lVar4 = *(long *)pMVar12;
            uVar11 = 0;
            do {
              puVar7[uVar9 + (int)uVar11] = *(short *)(lVar4 + uVar11 * 2) - (short)uVar3;
              uVar11 = uVar11 + 1;
            } while (uVar2 != uVar11);
          }
          uVar9 = uVar9 + *puVar13;
          pMVar12 = (MeshHeader *)&pMVar12[1].totalIndices;
          puVar13 = puVar13 + 0xc;
          uVar10 = uVar10 + 1;
        } while (uVar10 < pIVar5[2].platform);
      }
      d3d::unlockIndices(*(void **)(pIVar5 + 4));
      *(undefined8 *)(pIVar5 + 0x10) = 0;
      *(undefined8 *)(pIVar5 + 0x12) = 0;
      *(undefined8 *)(pIVar5 + 0xc) = 0;
      *(undefined8 *)(pIVar5 + 0xe) = 0;
      *(undefined8 *)(pIVar5 + 8) = 0;
      *(undefined8 *)(pIVar5 + 10) = 0;
      geometry->instData = pIVar5;
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,pIVar5,0);
    }
    else if (geometry->lockedSinceInst != 0) {
      (**(code **)&rwpipe[1].super_Pipeline)(geometry,geometry->instData,1);
    }
    geometry->lockedSinceInst = 0;
  }
  return;
}

Assistant:

static void
instance(rw::ObjPipeline *rwpipe, Atomic *atomic)
{
	ObjPipeline *pipe = (ObjPipeline*)rwpipe;
	Geometry *geo = atomic->geometry;
	// don't try to (re)instance native data
	if(geo->flags & Geometry::NATIVE)
		return;

	InstanceDataHeader *header = (InstanceDataHeader*)geo->instData;
	if(geo->instData){
		// Already have instanced data, so check if we have to reinstance
		assert(header->platform == PLATFORM_D3D9);
		if(header->serialNumber != geo->meshHeader->serialNum){
			// Mesh changed, so reinstance everything
			freeInstanceData(geo);
		}
	}

	// no instance or complete reinstance
	if(geo->instData == nil){
		geo->instData = instanceMesh(rwpipe, geo);
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 0);
	}else if(geo->lockedSinceInst)
		pipe->instanceCB(geo, (InstanceDataHeader*)geo->instData, 1);

	geo->lockedSinceInst = 0;
}